

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objects.hh
# Opt level: O2

void __thiscall discordpp::MessageComponentData::~MessageComponentData(MessageComponentData *this)

{
  std::
  unique_ptr<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>,_std::default_delete<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>_>
  ::~unique_ptr(&(this->values).
                 super_field<std::vector<discordpp::SelectOption,_std::allocator<discordpp::SelectOption>_>_>
                 .t_);
  std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr(&(this->component_type).t_);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&(this->custom_id).t_);
  ResolvedData::~ResolvedData(&this->super_ResolvedData);
  return;
}

Assistant:

MessageComponentData(
        omittable_field<std::map<Snowflake, User> > users = omitted,
        omittable_field<std::map<Snowflake, GuildMember> > members = omitted,
        omittable_field<std::map<Snowflake, Role> > roles = omitted,
        omittable_field<std::map<Snowflake, Channel> > channels = omitted,
        omittable_field<std::map<Snowflake, Message> > messages = omitted,
        omittable_field<std::map<Snowflake, Attachment> > attachments = omitted,
        field<std::string> custom_id = uninitialized,
        field<int> component_type = uninitialized,
        omittable_field<std::vector<SelectOption> > values = omitted
    ):
        ResolvedData(
            users,
            members,
            roles,
            channels,
            messages,
            attachments
        ),
        custom_id(custom_id),
        component_type(component_type),
        values(values)
    {}